

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_header.c
# Opt level: O0

int mk_header_prepare(mk_http_session *cs,mk_http_request *sr,mk_server *server)

{
  char *buf;
  int iVar1;
  mk_iov *mk_io;
  char **data;
  size_t sVar2;
  mk_ptr_t *p;
  mk_stream_input *in;
  mk_ptr_t *cl;
  mk_ptr_t *lm;
  mk_iov *iov;
  response_headers *sh;
  mk_ptr_t response;
  char *buffer;
  unsigned_long len;
  mk_server *pmStack_20;
  int i;
  mk_server *server_local;
  mk_http_request *sr_local;
  mk_http_session *cs_local;
  
  len._4_4_ = 0;
  buffer = (char *)0x0;
  response.len = 0;
  mk_io = &(sr->headers).headers_iov;
  if ((sr->headers).status == 7) {
    sh = (response_headers *)(sr->headers).custom_status.data;
    response.data = (char *)(sr->headers).custom_status.len;
  }
  else {
    for (len._4_4_ = 0; len._4_4_ < 0x26; len._4_4_ = len._4_4_ + 1) {
      if (status_response[len._4_4_].status == (sr->headers).status) {
        sh = (response_headers *)status_response[len._4_4_].response;
        response.data = (char *)(long)status_response[len._4_4_].length;
        break;
      }
    }
  }
  pmStack_20 = server;
  server_local = (mk_server *)sr;
  sr_local = (mk_http_request *)cs;
  if (len._4_4_ != 0x26) {
    mk_iov_add(mk_io,sh,(int)response.data,0);
    mk_iov_add(mk_io,(pmStack_20->clock_context->headers_preset).data,
               (int)(pmStack_20->clock_context->headers_preset).len,0);
    if (0 < (sr->headers).last_modified) {
      data = (char **)pthread_getspecific(mk_tls_cache_header_lm);
      iVar1 = mk_utils_utime2gmt(data,(sr->headers).last_modified);
      data[1] = (char *)(long)iVar1;
      mk_iov_add(mk_io,"Last-Modified: ",0xf,0);
      mk_iov_add(mk_io,*data,(int)data[1],0);
    }
    if ((sr->headers).connection == 0) {
      if (*(int *)((long)&sr_local->port + 4) == 0) {
        if (((server_local->pth_cond).__data.__g1_start.__value64 != 0) &&
           (server_local->kernel_version != 0xb)) {
          mk_iov_add(mk_io,"Connection: Keep-Alive\r\n",0x18,0);
        }
      }
      else {
        mk_iov_add(mk_io,"Connection: Close\r\n",0x13,0);
      }
    }
    else if ((sr->headers).connection == 0xb) {
      mk_iov_add(mk_io,"Connection: Upgrade\r\n",0x15,0);
    }
    if ((sr->headers).location != (char *)0x0) {
      mk_iov_add(mk_io,"Location: ",10,0);
      buf = (sr->headers).location;
      sVar2 = strlen((sr->headers).location);
      mk_iov_add(mk_io,buf,(int)sVar2,1);
    }
    if ((sr->headers).allow_methods.len != 0) {
      mk_iov_add(mk_io,"Allow: ",7,0);
      mk_iov_add(mk_io,(sr->headers).allow_methods.data,(int)(sr->headers).allow_methods.len,0);
    }
    if ((sr->headers).content_type.len != 0) {
      mk_iov_add(mk_io,(sr->headers).content_type.data,(int)(sr->headers).content_type.len,0);
    }
    if ((sr->headers).transfer_encoding == 0) {
      mk_iov_add(mk_io,"Transfer-Encoding: chunked\r\n",0x1c,0);
    }
    if (0 < (sr->headers).etag_len) {
      mk_iov_add(mk_io,(sr->headers).etag_buf,(sr->headers).etag_len,0);
    }
    if ((sr->headers).content_encoding.len != 0) {
      mk_iov_add(mk_io,"Content-Encoding: ",0x12,0);
      mk_iov_add(mk_io,(sr->headers).content_encoding.data,(int)(sr->headers).content_encoding.len,0
                );
    }
    if ((-1 < (sr->headers).content_length) && ((sr->headers).transfer_encoding != 0)) {
      p = (mk_ptr_t *)pthread_getspecific(mk_tls_cache_header_cl);
      mk_string_itop((sr->headers).content_length,p);
      mk_iov_add(mk_io,"Content-Length: ",0x10,0);
      mk_iov_add(mk_io,p->data,(int)p->len,0);
    }
    if (((sr->headers).content_length != 0) &&
       (((-1 < (sr->headers).ranges[0] || (-1 < (sr->headers).ranges[1])) &&
        (pmStack_20->resume == '\x01')))) {
      response.len = 0;
      if ((-1 < (sr->headers).ranges[0]) && ((sr->headers).ranges[1] == -1)) {
        mk_string_build((char **)&response.len,(unsigned_long *)&buffer,"%s bytes %d-%ld/%ld\r\n",
                        "Content-Range:",(ulong)(uint)(sr->headers).ranges[0],
                        (sr->headers).real_length + -1,(sr->headers).real_length);
        mk_iov_add(mk_io,(void *)response.len,(int)buffer,1);
      }
      if ((-1 < (sr->headers).ranges[0]) && (-1 < (sr->headers).ranges[1])) {
        mk_string_build((char **)&response.len,(unsigned_long *)&buffer,"%s bytes %d-%d/%ld\r\n",
                        "Content-Range:",(ulong)(uint)(sr->headers).ranges[0],
                        (ulong)(uint)(sr->headers).ranges[1],(sr->headers).real_length);
        mk_iov_add(mk_io,(void *)response.len,(int)buffer,1);
      }
      if (((sr->headers).ranges[0] == -1) && (0 < (sr->headers).ranges[1])) {
        mk_string_build((char **)&response.len,(unsigned_long *)&buffer,"%s bytes %ld-%ld/%ld\r\n",
                        "Content-Range:",(sr->headers).real_length - (long)(sr->headers).ranges[1],
                        (sr->headers).real_length + -1,(sr->headers).real_length);
        mk_iov_add(mk_io,(void *)response.len,(int)buffer,1);
      }
    }
    if ((sr->headers).upgrade == 0x14) {
      mk_iov_add(mk_io,"Upgrade: h2c\r\n",0xe,0);
    }
    if (((sr->headers).cgi == 0) || ((sr->headers).breakline == 1)) {
      if (*(long *)(server_local[1].server_signature + 8) == 0) {
        mk_iov_add(mk_io,"\r\n",2,0);
      }
      else {
        mk_iov_add(*(mk_iov **)(server_local[1].server_signature + 8),"\r\n",2,0);
      }
    }
    *(mk_iov **)&server_local->pid_status = mk_io;
    server_local->request_headers_allowed = (char **)(sr->headers).headers_iov.total_len;
    *(code **)&server_local->euid = mk_header_cb_finished;
    if (*(long *)(server_local[1].server_signature + 8) != 0) {
      *(undefined4 *)&(server_local->hosts).next = 1;
      server_local->open_flags = 0;
      (server_local->mimetype_list).prev = (mk_list *)0x0;
      (server_local->mimetype_list).next = (mk_list *)cb_stream_iov_extended_free;
      (server_local->mimetype_rb_head).root = (rb_tree_node *)&server_local->path_conf_root;
      *(undefined8 *)&server_local->safe_event_write =
           *(undefined8 *)(server_local[1].server_signature + 8);
      (server_local->plugins).prev =
           *(mk_list **)(*(long *)(server_local[1].server_signature + 8) + 0x10);
      mk_list_add_after((mk_list *)&(server_local->mimetype_rb_head).compare,
                        (mk_list *)&server_local->nhosts,
                        (mk_list *)&(server_local->server_software).len);
    }
    (sr->headers).sent = 1;
    return 0;
  }
  mk_print(0x1003,"Bug found in %s() at %s:%d","mk_header_prepare",
           "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/mk_server/mk_header.c"
           ,0xc3);
  abort();
}

Assistant:

int mk_header_prepare(struct mk_http_session *cs, struct mk_http_request *sr,
                      struct mk_server *server)
{
    int i = 0;
    unsigned long len = 0;
    char *buffer = 0;
    mk_ptr_t response;
    struct response_headers *sh;
    struct mk_iov *iov;

    sh = &sr->headers;
    iov = &sh->headers_iov;

    /* HTTP Status Code */
    if (sh->status == MK_CUSTOM_STATUS) {
        response.data = sh->custom_status.data;
        response.len = sh->custom_status.len;
    }
    else {
        for (i = 0; i < status_response_len; i++) {
            if (status_response[i].status == sh->status) {
                response.data = status_response[i].response;
                response.len  = status_response[i].length;
                break;
            }
        }
    }

    /* Invalid status set */
    mk_bug(i == status_response_len);

    mk_iov_add(iov, response.data, response.len, MK_FALSE);

    /*
     * Preset headers (mk_clock.c):
     *
     * - Server
     * - Date
     */
    mk_iov_add(iov,
               server->clock_context->headers_preset.data,
               server->clock_context->headers_preset.len,
               MK_FALSE);

    /* Last-Modified */
    if (sh->last_modified > 0) {
        mk_ptr_t *lm = MK_TLS_GET(mk_tls_cache_header_lm);
        lm->len = mk_utils_utime2gmt(&lm->data, sh->last_modified);

        mk_iov_add(iov,
                   mk_header_last_modified.data,
                   mk_header_last_modified.len,
                   MK_FALSE);
        mk_iov_add(iov,
                   lm->data,
                   lm->len,
                   MK_FALSE);
    }

    /* Connection */
    if (sh->connection == 0) {
        if (cs->close_now == MK_FALSE) {
            if (sr->connection.len > 0) {
                if (sr->protocol != MK_HTTP_PROTOCOL_11) {
                    mk_iov_add(iov,
                               mk_header_conn_ka.data,
                               mk_header_conn_ka.len,
                               MK_FALSE);
                }
            }
        }
        else {
            mk_iov_add(iov,
                       mk_header_conn_close.data,
                       mk_header_conn_close.len,
                       MK_FALSE);
        }
    }
    else if (sh->connection == MK_HEADER_CONN_UPGRADED) {
             mk_iov_add(iov,
                        mk_header_conn_upgrade.data,
                        mk_header_conn_upgrade.len,
                        MK_FALSE);
    }

    /* Location */
    if (sh->location != NULL) {
        mk_iov_add(iov,
                   mk_header_short_location.data,
                   mk_header_short_location.len,
                   MK_FALSE);

        mk_iov_add(iov,
                   sh->location,
                   strlen(sh->location),
                   MK_TRUE);
    }

    /* allowed methods */
    if (sh->allow_methods.len > 0) {
        mk_iov_add(iov,
                   mk_header_allow.data,
                   mk_header_allow.len,
                   MK_FALSE);
        mk_iov_add(iov,
                   sh->allow_methods.data,
                   sh->allow_methods.len,
                   MK_FALSE);
    }

    /* Content type */
    if (sh->content_type.len > 0) {
        mk_iov_add(iov,
                   sh->content_type.data,
                   sh->content_type.len,
                   MK_FALSE);
    }

    /*
     * Transfer Encoding: the transfer encoding header is just sent when
     * the response has some content defined by the HTTP status response
     */
    switch (sh->transfer_encoding) {
    case MK_HEADER_TE_TYPE_CHUNKED:
        mk_iov_add(iov,
                   mk_header_te_chunked.data,
                   mk_header_te_chunked.len,
                   MK_FALSE);
        break;
    }

    /* E-Tag */
    if (sh->etag_len > 0) {
        mk_iov_add(iov, sh->etag_buf, sh->etag_len, MK_FALSE);
    }

    /* Content-Encoding */
    if (sh->content_encoding.len > 0) {
        mk_iov_add(iov, mk_header_content_encoding.data,
                   mk_header_content_encoding.len,
                   MK_FALSE);
        mk_iov_add(iov, sh->content_encoding.data,
                   sh->content_encoding.len,
                   MK_FALSE);
    }

    /* Content-Length */
    if (sh->content_length >= 0 && sh->transfer_encoding != 0) {
        /* Map content length to MK_POINTER */
        mk_ptr_t *cl = MK_TLS_GET(mk_tls_cache_header_cl);
        mk_string_itop(sh->content_length, cl);

        /* Set headers */
        mk_iov_add(iov,
                   mk_header_content_length.data,
                   mk_header_content_length.len,
                   MK_FALSE);
        mk_iov_add(iov,
                   cl->data,
                   cl->len,
                   MK_FALSE);
    }

    if ((sh->content_length != 0 && (sh->ranges[0] >= 0 || sh->ranges[1] >= 0)) &&
        server->resume == MK_TRUE) {
        buffer = 0;

        /* yyy- */
        if (sh->ranges[0] >= 0 && sh->ranges[1] == -1) {
            mk_string_build(&buffer,
                            &len,
                            "%s bytes %d-%ld/%ld\r\n",
                            RH_CONTENT_RANGE,
                            sh->ranges[0],
                            (sh->real_length - 1), sh->real_length);
            mk_iov_add(iov, buffer, len, MK_TRUE);
        }

        /* yyy-xxx */
        if (sh->ranges[0] >= 0 && sh->ranges[1] >= 0) {
            mk_string_build(&buffer,
                            &len,
                            "%s bytes %d-%d/%ld\r\n",
                            RH_CONTENT_RANGE,
                            sh->ranges[0], sh->ranges[1], sh->real_length);

            mk_iov_add(iov, buffer, len, MK_TRUE);
        }

        /* -xxx */
        if (sh->ranges[0] == -1 && sh->ranges[1] > 0) {
            mk_string_build(&buffer,
                            &len,
                            "%s bytes %ld-%ld/%ld\r\n",
                            RH_CONTENT_RANGE,
                            (sh->real_length - sh->ranges[1]),
                            (sh->real_length - 1), sh->real_length);
            mk_iov_add(iov, buffer, len, MK_TRUE);
        }
    }

    if (sh->upgrade == MK_HEADER_UPGRADED_H2C) {
        mk_iov_add(iov, mk_header_upgrade_h2c.data, mk_header_upgrade_h2c.len,
                   MK_FALSE);
    }


    if (sh->cgi == SH_NOCGI || sh->breakline == MK_HEADER_BREAKLINE) {
        if (!sr->headers._extra_rows) {
            mk_iov_add(iov, mk_iov_crlf.data, mk_iov_crlf.len,
                       MK_FALSE);
        }
        else {
            mk_iov_add(sr->headers._extra_rows, mk_iov_crlf.data,
                       mk_iov_crlf.len, MK_FALSE);
        }
    }

    /*
     * Configure the Stream to dispatch the headers
     */

    /* Set the IOV input stream */
    sr->in_headers.buffer      = iov;
    sr->in_headers.bytes_total = iov->total_len;
    sr->in_headers.cb_finished = mk_header_cb_finished;

    if (sr->headers._extra_rows) {
        /* Our main sr->stream contains the main headers (header_iov)
         * and 'may' have already some linked data. If we have some
         * extra headers rows we need to link this IOV right after
         * the main header_iov.
         */
        struct mk_stream_input *in = &sr->in_headers_extra;
        in->type        = MK_STREAM_IOV;
        in->dynamic     = MK_FALSE;
        in->cb_consumed = NULL;
        in->cb_finished = cb_stream_iov_extended_free;
        in->stream      = &sr->stream;
        in->buffer      = sr->headers._extra_rows;
        in->bytes_total = sr->headers._extra_rows->total_len;

        mk_list_add_after(&sr->in_headers_extra._head,
                          &sr->in_headers._head,
                          &sr->stream.inputs);
    }

    sh->sent = MK_TRUE;

    return 0;
}